

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntermTraverse.cpp
# Opt level: O0

void __thiscall glslang::TIntermSelection::traverse(TIntermSelection *this,TIntermTraverser *it)

{
  int iVar1;
  byte local_19;
  bool visit;
  TIntermTraverser *it_local;
  TIntermSelection *this_local;
  
  local_19 = 1;
  if ((it->preVisit & 1U) != 0) {
    iVar1 = (*it->_vptr_TIntermTraverser[6])(it,0,this);
    local_19 = (byte)iVar1 & 1;
  }
  if (local_19 != 0) {
    TIntermTraverser::incrementDepth(it,(TIntermNode *)this);
    if ((it->rightToLeft & 1U) == 0) {
      (*(this->condition->super_TIntermNode)._vptr_TIntermNode[2])(this->condition,it);
      if (this->trueBlock != (TIntermNode *)0x0) {
        (*this->trueBlock->_vptr_TIntermNode[2])(this->trueBlock,it);
      }
      if (this->falseBlock != (TIntermNode *)0x0) {
        (*this->falseBlock->_vptr_TIntermNode[2])(this->falseBlock,it);
      }
    }
    else {
      if (this->falseBlock != (TIntermNode *)0x0) {
        (*this->falseBlock->_vptr_TIntermNode[2])(this->falseBlock,it);
      }
      if (this->trueBlock != (TIntermNode *)0x0) {
        (*this->trueBlock->_vptr_TIntermNode[2])(this->trueBlock,it);
      }
      (*(this->condition->super_TIntermNode)._vptr_TIntermNode[2])(this->condition,it);
    }
    TIntermTraverser::decrementDepth(it);
  }
  if ((local_19 != 0) && ((it->postVisit & 1U) != 0)) {
    (*it->_vptr_TIntermTraverser[6])(it,2,this);
  }
  return;
}

Assistant:

void TIntermSelection::traverse(TIntermTraverser *it)
{
    bool visit = true;

    if (it->preVisit)
        visit = it->visitSelection(EvPreVisit, this);

    if (visit) {
        it->incrementDepth(this);
        if (it->rightToLeft) {
            if (falseBlock)
                falseBlock->traverse(it);
            if (trueBlock)
                trueBlock->traverse(it);
            condition->traverse(it);
        } else {
            condition->traverse(it);
            if (trueBlock)
                trueBlock->traverse(it);
            if (falseBlock)
                falseBlock->traverse(it);
        }
        it->decrementDepth();
    }

    if (visit && it->postVisit)
        it->visitSelection(EvPostVisit, this);
}